

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deformableconv2d_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::DeformableConv2D_x86_avx::create_pipeline(DeformableConv2D_x86_avx *this,Option *opt)

{
  Mat *pMVar1;
  int iVar2;
  uint uVar3;
  int *piVar4;
  size_t sVar5;
  void *pvVar6;
  long *plVar7;
  Layer *pLVar8;
  int iVar9;
  ulong uVar10;
  undefined4 *puVar11;
  _func_int ***ppp_Var12;
  _func_int ***ppp_Var13;
  long lVar14;
  undefined4 *puVar15;
  ulong uVar16;
  long lVar17;
  Allocator *pAVar18;
  _func_int ***ppp_Var19;
  long lVar20;
  int iVar21;
  long lVar22;
  int k;
  ulong uVar23;
  uint uVar24;
  _func_int ***ppp_Var25;
  undefined1 auVar26 [16];
  ParamDict pd_5;
  ParamDict pd;
  undefined1 auStack_198 [8];
  undefined8 uStack_190;
  uint local_180;
  uint local_17c;
  Allocator *local_178;
  ParamDict local_170;
  ulong local_160;
  Mat local_158;
  void *local_110;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  int iStack_f8;
  Allocator *local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  int local_d8;
  size_t local_d0;
  DeformableConv2D_x86_avx *local_c8;
  Option *local_c0;
  ulong local_b8;
  undefined4 *local_b0;
  ModelBinFromMatArray local_a8;
  Mat local_98;
  undefined4 *local_50;
  Mat *local_48;
  long local_40;
  long local_38;
  
  switch((this->super_DeformableConv2D).activation_type) {
  case 1:
    uStack_190 = 0x5caf2a;
    pLVar8 = create_layer_cpu(0x1a);
    uStack_190 = 0x5caf3a;
    ParamDict::ParamDict((ParamDict *)&local_158);
    uStack_190 = 0x5caf46;
    (*pLVar8->_vptr_Layer[2])(pLVar8,&local_158);
    break;
  case 2:
    uStack_190 = 0x5cb008;
    pLVar8 = create_layer_cpu(0x1a);
    uStack_190 = 0x5cb018;
    ParamDict::ParamDict((ParamDict *)&local_158);
    uStack_190 = 0x5cb02d;
    ParamDict::set((ParamDict *)&local_158,0,*(this->super_DeformableConv2D).activation_params.data)
    ;
    uStack_190 = 0x5cb03b;
    (*pLVar8->_vptr_Layer[2])(pLVar8,&local_158);
    break;
  case 3:
    uStack_190 = 0x5caf80;
    pLVar8 = create_layer_cpu(0x36);
    uStack_190 = 0x5caf90;
    ParamDict::ParamDict((ParamDict *)&local_158);
    uStack_190 = 0x5cafa5;
    ParamDict::set((ParamDict *)&local_158,0,*(this->super_DeformableConv2D).activation_params.data)
    ;
    uStack_190 = 0x5cafc0;
    ParamDict::set((ParamDict *)&local_158,1,
                   *(float *)((long)(this->super_DeformableConv2D).activation_params.data + 4));
    uStack_190 = 0x5cafce;
    (*pLVar8->_vptr_Layer[2])(pLVar8,&local_158);
    break;
  case 4:
    uStack_190 = 0x5cafdd;
    pLVar8 = create_layer_cpu(0x1e);
    uStack_190 = 0x5cafed;
    ParamDict::ParamDict((ParamDict *)&local_158);
    uStack_190 = 0x5caff9;
    (*pLVar8->_vptr_Layer[2])(pLVar8,&local_158);
    break;
  case 5:
    uStack_190 = 0x5caf55;
    pLVar8 = create_layer_cpu(0x47);
    uStack_190 = 0x5caf65;
    ParamDict::ParamDict((ParamDict *)&local_158);
    uStack_190 = 0x5caf71;
    (*pLVar8->_vptr_Layer[2])(pLVar8,&local_158);
    break;
  case 6:
    uStack_190 = 0x5cb047;
    pLVar8 = create_layer_cpu(0x43);
    uStack_190 = 0x5cb057;
    ParamDict::ParamDict((ParamDict *)&local_158);
    uStack_190 = 0x5cb06c;
    ParamDict::set((ParamDict *)&local_158,0,*(this->super_DeformableConv2D).activation_params.data)
    ;
    uStack_190 = 0x5cb087;
    ParamDict::set((ParamDict *)&local_158,1,
                   *(float *)((long)(this->super_DeformableConv2D).activation_params.data + 4));
    uStack_190 = 0x5cb095;
    (*pLVar8->_vptr_Layer[2])(pLVar8,&local_158);
    break;
  default:
    pLVar8 = (Layer *)0x0;
    goto LAB_005cb09f;
  }
  uStack_190 = 0x5cb09f;
  ParamDict::~ParamDict((ParamDict *)&local_158);
LAB_005cb09f:
  if (pLVar8 != (Layer *)0x0) {
    uStack_190 = 0x5cb0b0;
    (*pLVar8->_vptr_Layer[4])(pLVar8,opt);
  }
  this->activation = pLVar8;
  iVar2 = (this->super_DeformableConv2D).kernel_w;
  lVar22 = (long)iVar2;
  iVar21 = (this->super_DeformableConv2D).kernel_h;
  local_178 = (Allocator *)(long)iVar21;
  local_17c = iVar21 * iVar2;
  uVar3 = (this->super_DeformableConv2D).num_output;
  local_b8 = (ulong)uVar3;
  uVar10 = (long)(this->super_DeformableConv2D).weight_data_size / (long)(int)local_17c;
  uVar10 = (ulong)(uint)((int)uVar10 >> 0x1f) << 0x20 | uVar10 & 0xffffffff;
  uVar16 = (long)uVar10 / (long)(int)uVar3;
  local_180 = (uint)uVar16;
  iVar21 = 1;
  uVar24 = 1;
  uVar10 = (long)uVar10 % (long)(int)uVar3 & 0xffffffff;
  if (opt->use_packing_layout == true) {
    uVar24 = (uint)((uVar16 & 3) == 0) * 3 + 1;
    if ((uVar16 & 7) == 0) {
      uVar24 = 8;
    }
    iVar21 = (uint)((uVar3 & 3) == 0) * 3 + 1;
    uVar10 = local_b8;
    if ((uVar3 & 7) == 0) {
      iVar21 = 8;
    }
  }
  if (opt->use_sgemm_convolution == true) {
    uStack_190 = 0x5cb14f;
    pLVar8 = create_layer_cpu(0x4a);
    this->gemm = pLVar8;
    uStack_190 = 0x5cb163;
    ParamDict::ParamDict(&local_170);
    uStack_190 = 0x5cb172;
    ParamDict::set(&local_170,2,0);
    uStack_190 = 0x5cb183;
    ParamDict::set(&local_170,3,0);
    uStack_190 = 0x5cb197;
    ParamDict::set(&local_170,4,1);
    uStack_190 = 0x5cb1a8;
    ParamDict::set(&local_170,5,0);
    uStack_190 = 0x5cb1bc;
    ParamDict::set(&local_170,6,1);
    uStack_190 = 0x5cb1d1;
    ParamDict::set(&local_170,7,(this->super_DeformableConv2D).num_output);
    uStack_190 = 0x5cb1e2;
    ParamDict::set(&local_170,8,0);
    iVar21 = local_180 * local_17c;
    uStack_190 = 0x5cb1ff;
    ParamDict::set(&local_170,9,iVar21);
    uStack_190 = 0x5cb21c;
    ParamDict::set(&local_170,10,-(uint)((this->super_DeformableConv2D).bias_term == 0) | 1);
    uStack_190 = 0x5cb230;
    ParamDict::set(&local_170,0xb,1);
    uStack_190 = 0x5cb242;
    (*this->gemm->_vptr_Layer[2])(this->gemm,&local_170);
    local_98.cstep = 0;
    local_98.data = (Allocator *)0x0;
    local_98.refcount._0_4_ = 0;
    local_98.refcount._4_4_ = 0;
    local_98.elemsize._0_4_ = 0;
    local_98.elempack = 0;
    local_98._48_8_ = SUB168(ZEXT816(0) << 0x40,4);
    uStack_190 = 0x5cb28d;
    local_98.elemsize._4_4_ = (int)local_98.refcount;
    local_98.allocator = (Allocator *)local_98.data;
    local_98.dims = (int)local_98.refcount;
    local_98.w = local_98.refcount._4_4_;
    local_98.c = local_98.elempack;
    Mat::reshape(&local_158,&(this->super_DeformableConv2D).weight_data,local_17c,local_180,
                 (this->super_DeformableConv2D).num_output,(Allocator *)0x0);
    uStack_190 = 0x5cb2b3;
    local_c0 = opt;
    Mat::create(&local_98,iVar21,(this->super_DeformableConv2D).num_output,4,(Allocator *)0x0);
    opt = local_c0;
    lVar22 = (long)(this->super_DeformableConv2D).num_output;
    if (0 < lVar22) {
      local_178 = (Allocator *)local_98.data;
      local_160 = (long)local_98.w * CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize)
      ;
      uVar10 = (ulong)uVar24;
      lVar17 = 0;
      do {
        if ((int)uVar24 <= (int)local_180) {
          lVar20 = (long)local_158.w *
                   CONCAT44(local_158.elemsize._4_4_,(undefined4)local_158.elemsize);
          ppp_Var12 = (_func_int ***)
                      ((long)(_func_int ***)local_158.data +
                      CONCAT44(local_158.elemsize._4_4_,(undefined4)local_158.elemsize) *
                      local_158.cstep * lVar17);
          ppp_Var19 = (_func_int ***)((long)(_func_int ***)local_98.data + local_160 * lVar17);
          lVar14 = 0;
          do {
            if (0 < (int)local_17c) {
              uVar23 = 0;
              uVar16 = uVar10;
              ppp_Var25 = ppp_Var12;
              ppp_Var13 = ppp_Var12;
              do {
                do {
                  *(undefined4 *)ppp_Var19 = *(undefined4 *)ppp_Var25;
                  ppp_Var19 = (_func_int ***)((long)ppp_Var19 + 4);
                  uVar16 = uVar16 - 1;
                  ppp_Var25 = (_func_int ***)((long)ppp_Var25 + lVar20);
                } while (uVar16 != 0);
                uVar23 = uVar23 + 1;
                ppp_Var25 = (_func_int ***)((long)ppp_Var13 + 4);
                uVar16 = uVar10;
                ppp_Var13 = ppp_Var25;
              } while (uVar23 != local_17c);
            }
            lVar14 = lVar14 + uVar10;
            ppp_Var12 = (_func_int ***)((long)ppp_Var12 + lVar20 * uVar10);
          } while (lVar14 < (long)((long)(int)local_180 - (ulong)(uVar24 - 1)));
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 != lVar22);
    }
    piVar4 = (int *)CONCAT44(local_158.refcount._4_4_,(int)local_158.refcount);
    local_c8 = this;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (local_158.allocator == (Allocator *)0x0) {
          if ((Allocator *)local_158.data != (Allocator *)0x0) {
            uStack_190 = 0x5cb67d;
            free(local_158.data);
          }
        }
        else {
          uStack_190 = 0x5cb3cc;
          (*(local_158.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    if ((this->super_DeformableConv2D).bias_term == 0) {
      piVar4 = (int *)CONCAT44(local_98.refcount._4_4_,(int)local_98.refcount);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + 1;
        UNLOCK();
      }
      local_158.data = local_98.data;
      local_158.refcount._0_4_ = (int)local_98.refcount;
      local_158.refcount._4_4_ = local_98.refcount._4_4_;
      local_158.elemsize._0_4_ = (undefined4)local_98.elemsize;
      local_158.elemsize._4_4_ = local_98.elemsize._4_4_;
      local_158.elempack = local_98.elempack;
      local_158.allocator = local_98.allocator;
      local_158.dims = local_98.dims;
      local_158.w = local_98.w;
      local_158.h = local_98.h;
      local_158.d = local_98.d;
      local_158.c = local_98.c;
      local_158.cstep = local_98.cstep;
      pLVar8 = this->gemm;
      uStack_190 = 0x5cbba6;
      ModelBinFromMatArray::ModelBinFromMatArray(&local_a8,&local_158);
      uStack_190 = 0x5cbbb7;
      (*pLVar8->_vptr_Layer[3])(pLVar8,&local_a8);
      uStack_190 = 0x5cbbc4;
      ModelBinFromMatArray::~ModelBinFromMatArray(&local_a8);
      piVar4 = (int *)CONCAT44(local_158.refcount._4_4_,(int)local_158.refcount);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (local_158.allocator == (Allocator *)0x0) {
            if ((Allocator *)local_158.data != (Allocator *)0x0) {
              uStack_190 = 0x5cbc06;
              free(local_158.data);
            }
          }
          else {
            uStack_190 = 0x5cbbf0;
            (*(local_158.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      lVar22 = 0x40;
      auVar26._0_12_ = ZEXT812(0);
      auVar26._12_4_ = 0;
      do {
        *(undefined8 *)((long)&local_158.data + lVar22) = 0;
        *(undefined1 (*) [16])(auStack_198 + lVar22) = auVar26;
        *(undefined1 (*) [16])((long)&uStack_190 + lVar22 + 4) = auVar26;
        *(undefined1 (*) [16])((long)&local_178 + lVar22) = auVar26;
        *(undefined1 (*) [16])((long)&local_170._vptr_ParamDict + lVar22 + 4) = auVar26;
        lVar22 = lVar22 + 0x48;
      } while (lVar22 != 0xd0);
      piVar4 = (int *)CONCAT44(local_98.refcount._4_4_,(int)local_98.refcount);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + 1;
        UNLOCK();
      }
      piVar4 = (int *)CONCAT44(local_158.refcount._4_4_,(int)local_158.refcount);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (local_158.allocator == (Allocator *)0x0) {
            if ((Allocator *)local_158.data != (Allocator *)0x0) {
              uStack_190 = 0x5cb771;
              free(local_158.data);
            }
          }
          else {
            uStack_190 = 0x5cb6f8;
            (*(local_158.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_158.data = local_98.data;
      local_158.refcount._0_4_ = (int)local_98.refcount;
      local_158.refcount._4_4_ = local_98.refcount._4_4_;
      local_158.elemsize._0_4_ = (undefined4)local_98.elemsize;
      local_158.elemsize._4_4_ = local_98.elemsize._4_4_;
      local_158.elempack = local_98.elempack;
      local_158.allocator = local_98.allocator;
      local_158.dims = local_98.dims;
      local_158.w = local_98.w;
      local_158.h = local_98.h;
      local_158.d = local_98.d;
      local_158.c = local_98.c;
      local_158.cstep = local_98.cstep;
      if ((Mat *)&local_110 != &(this->super_DeformableConv2D).bias_data) {
        piVar4 = (this->super_DeformableConv2D).bias_data.refcount;
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + 1;
          UNLOCK();
        }
        piVar4 = (int *)CONCAT44(uStack_104,uStack_108);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            if (local_f0 == (Allocator *)0x0) {
              if (local_110 != (void *)0x0) {
                uStack_190 = 0x5cb8cd;
                free(local_110);
              }
            }
            else {
              uStack_190 = 0x5cb82d;
              (*local_f0->_vptr_Allocator[3])();
            }
          }
        }
        local_110 = (this->super_DeformableConv2D).bias_data.data;
        piVar4 = (this->super_DeformableConv2D).bias_data.refcount;
        uStack_108 = SUB84(piVar4,0);
        uStack_104 = (undefined4)((ulong)piVar4 >> 0x20);
        sVar5 = (this->super_DeformableConv2D).bias_data.elemsize;
        uStack_100 = (undefined4)sVar5;
        uStack_fc = (undefined4)(sVar5 >> 0x20);
        iStack_f8 = (this->super_DeformableConv2D).bias_data.elempack;
        local_f0 = (this->super_DeformableConv2D).bias_data.allocator;
        local_e8._0_4_ = (this->super_DeformableConv2D).bias_data.dims;
        local_e8._4_4_ = (this->super_DeformableConv2D).bias_data.w;
        uStack_e0._0_4_ = (this->super_DeformableConv2D).bias_data.h;
        uStack_e0._4_4_ = (this->super_DeformableConv2D).bias_data.d;
        local_d8 = (this->super_DeformableConv2D).bias_data.c;
        local_d0 = (this->super_DeformableConv2D).bias_data.cstep;
      }
      pLVar8 = this->gemm;
      uStack_190 = 0x5cb979;
      ModelBinFromMatArray::ModelBinFromMatArray(&local_a8,&local_158);
      uStack_190 = 0x5cb98a;
      (*pLVar8->_vptr_Layer[3])(pLVar8,&local_a8);
      uStack_190 = 0x5cb997;
      ModelBinFromMatArray::~ModelBinFromMatArray(&local_a8);
      lVar22 = 0x48;
      do {
        piVar4 = *(int **)((long)&local_158.refcount + lVar22);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            pvVar6 = *(void **)((long)&local_158.data + lVar22);
            plVar7 = *(long **)((long)&local_158.allocator + lVar22);
            if (plVar7 == (long *)0x0) {
              if (pvVar6 != (void *)0x0) {
                uStack_190 = 0x5cb9d7;
                free(pvVar6);
              }
            }
            else {
              uStack_190 = 0x5cb9c4;
              (**(code **)(*plVar7 + 0x18))();
            }
          }
        }
        *(undefined8 *)((long)&local_158.cstep + lVar22) = 0;
        *(undefined8 *)((long)&local_158.refcount + lVar22 + 4) = 0;
        *(undefined8 *)((long)&local_158.elemsize + lVar22 + 4) = 0;
        *(undefined8 *)((long)&local_158.data + lVar22) = 0;
        *(undefined8 *)((long)&local_158.refcount + lVar22) = 0;
        *(undefined8 *)((long)&local_158.dims + lVar22) = 0;
        *(undefined8 *)((long)&local_158.h + lVar22) = 0;
        *(undefined4 *)((long)&local_158.c + lVar22) = 0;
        lVar22 = lVar22 + -0x48;
        opt = local_c0;
      } while (lVar22 != -0x48);
    }
    uStack_190 = 0x5cba22;
    (*this->gemm->_vptr_Layer[4])(this->gemm,opt);
    piVar4 = (int *)CONCAT44(local_98.refcount._4_4_,(int)local_98.refcount);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (local_98.allocator == (Allocator *)0x0) {
          if ((Allocator *)local_98.data != (Allocator *)0x0) {
            uStack_190 = 0x5cba5e;
            free(local_98.data);
          }
        }
        else {
          uStack_190 = 0x5cba4f;
          (*(local_98.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_98.cstep = 0;
    local_98.data = (void *)0x0;
    local_98.refcount._0_4_ = 0;
    local_98.refcount._4_4_ = 0;
    local_98.elemsize._0_4_ = 0;
    local_98.elemsize._4_4_ = 0;
    local_98.elempack = 0;
    local_98.dims = 0;
    local_98.w = 0;
    local_98.h = 0;
    local_98.d = 0;
    local_98.c = 0;
    uStack_190 = 0x5cba9d;
    ParamDict::~ParamDict(&local_170);
  }
  else {
    pMVar1 = &this->weight_data_tm;
    if ((iVar21 == 1) && (uVar24 == 1)) {
      piVar4 = (this->super_DeformableConv2D).weight_data.refcount;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + 1;
        UNLOCK();
      }
      piVar4 = (this->weight_data_tm).refcount;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          pvVar6 = (this->weight_data_tm).data;
          pAVar18 = (this->weight_data_tm).allocator;
          if (pAVar18 == (Allocator *)0x0) {
            if (pvVar6 != (void *)0x0) {
              uStack_190 = 0x5cb83f;
              free(pvVar6);
            }
          }
          else {
            uStack_190 = 0x5cb429;
            (*pAVar18->_vptr_Allocator[3])(pAVar18,pvVar6,uVar10);
          }
        }
      }
      (this->weight_data_tm).cstep = 0;
      *(undefined8 *)((long)&(this->weight_data_tm).refcount + 4) = 0;
      *(undefined8 *)((long)&(this->weight_data_tm).elemsize + 4) = 0;
      pMVar1->data = (void *)0x0;
      (this->weight_data_tm).refcount = (int *)0x0;
      piVar4 = (this->super_DeformableConv2D).weight_data.refcount;
      (this->weight_data_tm).data = (this->super_DeformableConv2D).weight_data.data;
      (this->weight_data_tm).refcount = piVar4;
      (this->weight_data_tm).elemsize = (this->super_DeformableConv2D).weight_data.elemsize;
      (this->weight_data_tm).elempack = (this->super_DeformableConv2D).weight_data.elempack;
      (this->weight_data_tm).allocator = (this->super_DeformableConv2D).weight_data.allocator;
      iVar21 = (this->super_DeformableConv2D).weight_data.w;
      iVar2 = (this->super_DeformableConv2D).weight_data.h;
      iVar9 = (this->super_DeformableConv2D).weight_data.d;
      (this->weight_data_tm).dims = (this->super_DeformableConv2D).weight_data.dims;
      (this->weight_data_tm).w = iVar21;
      (this->weight_data_tm).h = iVar2;
      (this->weight_data_tm).d = iVar9;
      (this->weight_data_tm).c = (this->super_DeformableConv2D).weight_data.c;
      (this->weight_data_tm).cstep = (this->super_DeformableConv2D).weight_data.cstep;
    }
    else {
      local_50 = (undefined4 *)(this->super_DeformableConv2D).weight_data.data;
      iVar9 = uVar24 * iVar21;
      uStack_190 = 0x5cb487;
      local_c8 = this;
      local_c0 = opt;
      local_48 = pMVar1;
      Mat::create(pMVar1,(int)(local_180 * local_17c * uVar3) / iVar9,(ulong)(uint)(iVar9 * 4),iVar9
                  ,(Allocator *)0x0);
      pMVar1 = local_48;
      if (0 < (int)uVar3) {
        pvVar6 = (local_c8->weight_data_tm).data;
        lVar17 = (long)(int)local_180 * (long)local_178 * lVar22;
        local_40 = lVar17 * 4;
        local_38 = lVar22 * 4;
        local_160 = 0;
        do {
          if (0 < (int)local_178) {
            local_b0 = local_50;
            pAVar18 = (Allocator *)0x0;
            do {
              if (0 < iVar2) {
                lVar14 = 0;
                puVar11 = local_b0;
                do {
                  if (0 < (int)local_180) {
                    uVar10 = (ulong)(uint)((int)local_160 >> 0x1f) << 0x20 | local_160 & 0xffffffff;
                    uVar16 = 0;
                    puVar15 = puVar11;
                    do {
                      uVar23 = (ulong)(uint)((int)uVar16 >> 0x1f) << 0x20 | uVar16 & 0xffffffff;
                      *(undefined4 *)
                       ((long)pvVar6 +
                       (long)(int)((((int)((long)uVar23 / (long)(int)uVar24) +
                                    ((int)lVar14 +
                                    ((int)((long)uVar10 / (long)iVar21) * (int)local_178 +
                                    (int)pAVar18) * iVar2) * ((int)local_180 / (int)uVar24)) *
                                    uVar24 + (int)((long)uVar23 % (long)(int)uVar24)) * iVar21 +
                                  (int)((long)uVar10 % (long)iVar21)) * 4) = *puVar15;
                      uVar16 = uVar16 + 1;
                      puVar15 = puVar15 + (long)local_178 * lVar22;
                    } while (local_180 != uVar16);
                  }
                  lVar14 = lVar14 + 1;
                  puVar11 = puVar11 + 1;
                } while (lVar14 != lVar22);
              }
              pAVar18 = (Allocator *)((long)&pAVar18->_vptr_Allocator + 1);
              local_b0 = local_b0 + lVar22;
            } while (pAVar18 != local_178);
          }
          local_160 = local_160 + 1;
          local_50 = local_50 + lVar17;
        } while (local_160 != local_b8);
      }
      uStack_190 = 0x5cb604;
      Mat::reshape(&local_158,local_48,(int)local_180 / (int)uVar24,local_17c,
                   (int)((long)((ulong)(uint)((int)local_b8 >> 0x1f) << 0x20 | local_b8 & 0xffffffff
                               ) / (long)iVar21),(Allocator *)0x0);
      opt = local_c0;
      this = local_c8;
      if (&local_158 != pMVar1) {
        piVar4 = (int *)CONCAT44(local_158.refcount._4_4_,(int)local_158.refcount);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + 1;
          UNLOCK();
        }
        piVar4 = (local_c8->weight_data_tm).refcount;
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            pvVar6 = (local_c8->weight_data_tm).data;
            pAVar18 = (local_c8->weight_data_tm).allocator;
            if (pAVar18 == (Allocator *)0x0) {
              if (pvVar6 != (void *)0x0) {
                uStack_190 = 0x5cbc18;
                free(pvVar6);
              }
            }
            else {
              uStack_190 = 0x5cb663;
              (*pAVar18->_vptr_Allocator[3])();
            }
          }
        }
        (this->weight_data_tm).cstep = 0;
        *(undefined8 *)((long)&pMVar1->refcount + 4) = 0;
        *(undefined8 *)((long)&pMVar1->elemsize + 4) = 0;
        pMVar1->data = (void *)0x0;
        pMVar1->refcount = (int *)0x0;
        (this->weight_data_tm).dims = 0;
        (this->weight_data_tm).w = 0;
        (this->weight_data_tm).h = 0;
        (this->weight_data_tm).d = 0;
        (this->weight_data_tm).c = 0;
        (this->weight_data_tm).data = local_158.data;
        (this->weight_data_tm).refcount =
             (int *)CONCAT44(local_158.refcount._4_4_,(int)local_158.refcount);
        (this->weight_data_tm).elemsize =
             CONCAT44(local_158.elemsize._4_4_,(undefined4)local_158.elemsize);
        (this->weight_data_tm).elempack = local_158.elempack;
        (this->weight_data_tm).allocator = local_158.allocator;
        (this->weight_data_tm).dims = local_158.dims;
        (this->weight_data_tm).w = local_158.w;
        (this->weight_data_tm).h = local_158.h;
        (this->weight_data_tm).d = local_158.d;
        (this->weight_data_tm).c = local_158.c;
        (this->weight_data_tm).cstep = local_158.cstep;
      }
      piVar4 = (int *)CONCAT44(local_158.refcount._4_4_,(int)local_158.refcount);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (local_158.allocator == (Allocator *)0x0) {
            if ((Allocator *)local_158.data != (Allocator *)0x0) {
              uStack_190 = 0x5cbcda;
              free(local_158.data);
            }
          }
          else {
            uStack_190 = 0x5cbcc4;
            (*(local_158.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
  }
  if (opt->lightmode == true) {
    piVar4 = (this->super_DeformableConv2D).weight_data.refcount;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        pvVar6 = (this->super_DeformableConv2D).weight_data.data;
        pAVar18 = (this->super_DeformableConv2D).weight_data.allocator;
        if (pAVar18 == (Allocator *)0x0) {
          if (pvVar6 != (void *)0x0) {
            uStack_190 = 0x5cbae2;
            free(pvVar6);
          }
        }
        else {
          uStack_190 = 0x5cbad3;
          (*pAVar18->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_DeformableConv2D).weight_data.cstep = 0;
    *(undefined8 *)((long)&(this->super_DeformableConv2D).weight_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_DeformableConv2D).weight_data.elemsize + 4) = 0;
    (this->super_DeformableConv2D).weight_data.data = (void *)0x0;
    (this->super_DeformableConv2D).weight_data.refcount = (int *)0x0;
    (this->super_DeformableConv2D).weight_data.dims = 0;
    (this->super_DeformableConv2D).weight_data.w = 0;
    (this->super_DeformableConv2D).weight_data.h = 0;
    (this->super_DeformableConv2D).weight_data.d = 0;
    (this->super_DeformableConv2D).weight_data.c = 0;
  }
  return 0;
}

Assistant:

int DeformableConv2D_x86_avx::create_pipeline(const Option& opt)
{
    activation = create_activation_layer(activation_type, activation_params, opt);

    int kernel_size = kernel_w * kernel_h;
    int num_input = weight_data_size / kernel_size / num_output;

    int elempack = 1;
    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        elempack = num_input % 16 == 0 ? 16 : num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    if (opt.use_sgemm_convolution)
    {
        const int maxk = kernel_w * kernel_h;

        gemm = ncnn::create_layer_cpu(ncnn::LayerType::Gemm);

        ncnn::ParamDict pd;
        pd.set(2, 0);                   // transA
        pd.set(3, 0);                   // transB
        pd.set(4, 1);                   // constantA
        pd.set(5, 0);                   // constantB
        pd.set(6, 1);                   // constantC
        pd.set(7, num_output);          // M = outch
        pd.set(8, 0);                   // N = size
        pd.set(9, maxk * num_input);    // K = maxk*inch
        pd.set(10, bias_term ? 1 : -1); // constant_broadcast_type_C = (M)
        pd.set(11, 1);                  // output_N1M

        gemm->load_param(pd);

        // maxk-inch-outch to pa-maxk-inch/pa-outch
        Mat tmp;
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, num_input, num_output);

            tmp.create(maxk * num_input, num_output);

            for (int q = 0; q < num_output; q += 1)
            {
                float* g00 = tmp.row(q);

                for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
                {
                    for (int k = 0; k < maxk; k++)
                    {
                        for (int i = 0; i < elempack; i++)
                        {
                            const float* k00 = weight_data_r2.channel(q).row(p + i);
                            g00[0] = k00[k];
                            g00++;
                        }
                    }
                }
            }
        }

        if (bias_term)
        {
            ncnn::Mat weights[2];
            weights[0] = tmp;
            weights[1] = bias_data;

            gemm->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[1];
            weights[0] = tmp;

            gemm->load_model(ModelBinFromMatArray(weights));
        }

        gemm->create_pipeline(opt);
    }
    else if (elempack == 1 && out_elempack == 1)
    {
        weight_data_tm = weight_data;
    }
    else
    {
        deformableconv2d_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
    }

    if (opt.lightmode)
        weight_data.release();

    return 0;
}